

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnViewPrivate::clearConnections(QColumnViewPrivate *this)

{
  pointer pCVar1;
  Span *pSVar2;
  ulong uVar3;
  Connection *connection;
  pointer pCVar4;
  long in_FS_OFFSET;
  piter local_38;
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::disconnect(&this->animationConnection);
  pCVar1 = (this->gripConnections).
           super__Vector_base<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar4 = (this->gripConnections).
                super__Vector_base<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar4 != pCVar1; pCVar4 = pCVar4 + 1) {
    QObject::disconnect(pCVar4);
  }
  local_28.d = (this->viewConnections).d;
  if ((local_28.d != (Data *)0x0) &&
     (((local_28.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_28.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_28.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38 = (piter)QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
                    ::begin(&local_28);
  while( true ) {
    if (local_38.d ==
        (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
         *)0x0 && local_38.bucket == 0) break;
    pSVar2 = (local_38.d)->spans;
    uVar3 = local_38.bucket >> 7;
    disconnectView(this,*(QAbstractItemView **)
                         pSVar2[uVar3].entries[pSVar2[uVar3].offsets[(uint)local_38.bucket & 0x7f]].
                         storage.data);
    QHashPrivate::
    iterator<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
    ::operator++(&local_38);
  }
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  ::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewPrivate::clearConnections()
{
#if QT_CONFIG(animation)
    QObject::disconnect(animationConnection);
#endif
    for (const QMetaObject::Connection &connection : gripConnections)
        QObject::disconnect(connection);
    const auto copy = viewConnections;  // disconnectView modifies this container
    for (auto it = copy.keyBegin(); it != copy.keyEnd(); ++it)
        disconnectView(*it);
}